

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qflatmap_p.h
# Opt level: O3

iterator __thiscall
QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>
::erase(QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>
        *this,iterator it)

{
  void *pvVar1;
  iterator ppQVar2;
  long lVar3;
  iterator iVar4;
  
  lVar3 = it.i;
  pvVar1 = (this->c).values.super_QVLABase<QDialogButtonBox::StandardButton>.super_QVLABaseBase.ptr;
  QVLABase<QDialogButtonBox::StandardButton>::erase
            (&(this->c).values.super_QVLABase<QDialogButtonBox::StandardButton>,
             (const_iterator)((long)pvVar1 + lVar3 * 4),
             (const_iterator)((long)pvVar1 + lVar3 * 4 + 4));
  pvVar1 = (this->c).keys.super_QVLABase<QPushButton_*>.super_QVLABaseBase.ptr;
  ppQVar2 = QVLABase<QPushButton_*>::erase
                      ((QVLABase<QPushButton_*> *)this,(const_iterator)((long)pvVar1 + lVar3 * 8),
                       (const_iterator)((long)pvVar1 + lVar3 * 8 + 8));
  iVar4.i = (long)ppQVar2 -
            (long)(this->c).keys.super_QVLABase<QPushButton_*>.super_QVLABaseBase.ptr >> 3;
  iVar4.c = &this->c;
  return iVar4;
}

Assistant:

iterator erase(iterator it)
    {
        c.values.erase(toValuesIterator(it));
        return fromKeysIterator(c.keys.erase(toKeysIterator(it)));
    }